

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

void __thiscall
irr::core::string<unsigned_short>::reallocate(string<unsigned_short> *this,s32 new_size)

{
  unsigned_short *puVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  unsigned_short *puVar4;
  int local_34;
  int local_28;
  s32 i;
  s32 amount;
  unsigned_short *old_array;
  s32 new_size_local;
  string<unsigned_short> *this_local;
  
  puVar1 = this->array;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_size;
  uVar3 = SUB168(auVar2 * ZEXT816(2),0);
  if (SUB168(auVar2 * ZEXT816(2),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar4 = (unsigned_short *)operator_new__(uVar3);
  this->array = puVar4;
  this->allocated = new_size;
  local_34 = new_size;
  if (this->used < new_size) {
    local_34 = this->used;
  }
  for (local_28 = 0; local_28 < local_34; local_28 = local_28 + 1) {
    this->array[local_28] = puVar1[local_28];
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (puVar1 != (unsigned_short *)0x0) {
    operator_delete__(puVar1);
  }
  return;
}

Assistant:

void reallocate(s32 new_size)
	{
		T* old_array = array;

		array = new T[new_size];
		allocated = new_size;
		
		s32 amount = used < new_size ? used : new_size;
		for (s32 i=0; i<amount; ++i)
			array[i] = old_array[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_array;
	}